

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * __thiscall
cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *path)

{
  allocator local_39;
  string local_38;
  cmSystemTools *local_18;
  char *path_local;
  
  local_18 = this;
  path_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,(char *)this,&local_39);
  cmsys::SystemTools::ConvertToUnixOutputPath(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ConvertToRunCommandPath(const char* path)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  return cmSystemTools::ConvertToWindowsOutputPath(path);
#else
  return cmSystemTools::ConvertToUnixOutputPath(path);
#endif
}